

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation_axis.cpp
# Opt level: O2

void __thiscall
chrono::ChFunctionRotation_axis::ArchiveOUT(ChFunctionRotation_axis *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChVector<double>_> local_48;
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChFunctionRotation_axis>(marchive);
  ChFunctionRotation::ArchiveOUT(&this->super_ChFunctionRotation,marchive);
  local_30._value = &this->fangle;
  local_30._name = "fangle";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->axis;
  local_48._name = "axis";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  return;
}

Assistant:

void ChFunctionRotation_axis::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChFunctionRotation_axis>();
	// serialize parent class
    ChFunctionRotation::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(fangle);
	marchive << CHNVP(axis);
}